

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

RegexPattern *
Js::JavascriptRegExp::CreatePattern(Var aValue,Var options,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  charcount_t csz;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cszOpts;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar9;
  char16 *pszOpts;
  
  bVar2 = VarIs<Js::JavascriptString>(aValue);
  if (bVar2) {
    pJVar7 = VarTo<Js::JavascriptString>(aValue);
  }
  else {
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d14984;
      *puVar8 = 0;
    }
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00d14984;
      *puVar8 = 0;
    }
    if ((ulong)aValue >> 0x32 == 0 && ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00d14984;
        *puVar8 = 0;
      }
      TVar3 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar3) {
        BVar5 = RecyclableObject::IsExternal(this);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
LAB_00d14984:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar8 = 0;
        }
        TVar3 = TypeIds_FirstNumberType;
      }
    }
    else {
      TVar3 = TypeIds_FirstNumberType;
    }
    if (TVar3 == TypeIds_Undefined) {
      pJVar7 = JavascriptLibrary::GetEmptyString
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      pJVar7 = JavascriptConversion::ToString(aValue,scriptContext);
    }
  }
  csz = JavascriptString::GetLength(pJVar7);
  iVar4 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
  if (options != (Var)0x0) {
    BVar5 = JavascriptOperators::IsUndefinedObject(options);
    if (BVar5 == 0) {
      if ((ulong)options >> 0x30 == 0) {
        bVar2 = VarIsImpl<Js::JavascriptString>((RecyclableObject *)options);
        if (!bVar2) goto LAB_00d1493a;
        pJVar7 = VarTo<Js::JavascriptString>(options);
      }
      else {
LAB_00d1493a:
        pJVar7 = JavascriptConversion::ToString(options,scriptContext);
      }
      iVar6 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar7);
      pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar6);
      cszOpts = JavascriptString::GetLength(pJVar7);
      goto LAB_00d14962;
    }
  }
  cszOpts = 0;
  pszOpts = (char16 *)0x0;
LAB_00d14962:
  pRVar9 = RegexHelper::CompileDynamic
                     (scriptContext,(char16 *)CONCAT44(extraout_var,iVar4),csz,pszOpts,cszOpts,false
                     );
  return pRVar9;
}

Assistant:

UnifiedRegex::RegexPattern* JavascriptRegExp::CreatePattern(Var aValue, Var options, ScriptContext *scriptContext)
    {
        JavascriptString * strBody;

        if (VarIs<JavascriptString>(aValue))
        {
            strBody = VarTo<JavascriptString>(aValue);
        }
        else if (JavascriptOperators::GetTypeId(aValue) == TypeIds_Undefined)
        {
            strBody = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            strBody = JavascriptConversion::ToString(aValue, scriptContext); // must be null terminated!
        }

        int cBody = strBody->GetLength();
        const char16 *szRegex = strBody->GetSz();
        int cOpts = 0;
        const char16 *szOptions = nullptr;

        JavascriptString * strOptions = nullptr;
        if (options != nullptr && !JavascriptOperators::IsUndefinedObject(options))
        {
            if (VarIs<JavascriptString>(options))
            {
                strOptions = VarTo<JavascriptString>(options);
            }
            else
            {
                strOptions = JavascriptConversion::ToString(options, scriptContext);
            }

            szOptions = strOptions->GetSz(); // must be null terminated!
            cOpts = strOptions->GetLength();
        }

        UnifiedRegex::RegexPattern* pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);

        return pattern;
    }